

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UpsampleLayerParams::SerializeWithCachedSizes
          (UpsampleLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  UpsampleLayerParams_InterpolationMode UVar2;
  UpsampleLayerParams_LinearUpsampleMode UVar3;
  uint64 value;
  RepeatedField<float> *this_00;
  float *a;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  UpsampleLayerParams *this_local;
  
  iVar1 = scalingfactor_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_scalingfactor_cached_byte_size_);
  }
  local_20 = 0;
  iVar1 = scalingfactor_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    value = scalingfactor(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  UVar2 = mode(this);
  if (UVar2 != UpsampleLayerParams_InterpolationMode_NN) {
    UVar2 = mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(5,UVar2,output);
  }
  UVar3 = linearupsamplemode(this);
  if (UVar3 != UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
    UVar3 = linearupsamplemode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(6,UVar3,output);
  }
  iVar1 = fractionalscalingfactor_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(7,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_fractionalscalingfactor_cached_byte_size_);
    this_00 = fractionalscalingfactor(this);
    a = google::protobuf::RepeatedField<float>::data(this_00);
    iVar1 = fractionalscalingfactor_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(a,iVar1,output);
  }
  return;
}

Assistant:

void UpsampleLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.UpsampleLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 scalingFactor = 1;
  if (this->scalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalingfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->scalingfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->scalingfactor(i), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->mode(), output);
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->linearupsamplemode(), output);
  }

  // repeated float fractionalScalingFactor = 7;
  if (this->fractionalscalingfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_fractionalscalingfactor_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->fractionalscalingfactor().data(), this->fractionalscalingfactor_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.UpsampleLayerParams)
}